

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O3

_Bool is_acceptable(automaton *a,char state)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  _Bool _Var5;
  
  sVar2 = strlen(a->acceptable_states);
  if ((int)(uint)sVar2 < 1) {
    _Var5 = false;
  }
  else {
    _Var5 = true;
    if (a->acceptable_states[0] != state) {
      uVar3 = (ulong)((uint)sVar2 & 0x7fffffff);
      lVar1 = 0;
      do {
        lVar4 = lVar1;
        if (uVar3 - 1 == lVar4) break;
        lVar1 = lVar4 + 1;
      } while (a->acceptable_states[lVar4 + 1] != state);
      _Var5 = lVar4 + 1U < uVar3;
    }
  }
  return _Var5;
}

Assistant:

bool is_acceptable(const automaton * a, char state) {
    assert(state >= 0 + STR_STORAGE_VAL_OFFSET);
    assert(state < a->states_size + STR_STORAGE_VAL_OFFSET);

    size_t acceptable_states_length = strlen(a->acceptable_states);
    int i;
    for(i=0; i<(int)acceptable_states_length; i++) {
        if(a->acceptable_states[i] == state) {
            return true;
        }
    }
    assert(i == acceptable_states_length);
    return false;
}